

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::Option(ParsedScene *this,string *name,string *value,FileLoc loc)

{
  int iVar1;
  char *pcVar2;
  string *this_00;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  anon_unknown_191::normalizeArg
            (&local_68,(anon_unknown_191 *)(name->_M_dataplus)._M_p,(string *)name->_M_string_length
            );
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)value);
    if (iVar1 == 0) {
      *(undefined1 *)((long)Options + 5) = 1;
      goto LAB_0033a6a8;
    }
    iVar1 = std::__cxx11::string::compare((char *)value);
    if (iVar1 == 0) {
      *(undefined1 *)((long)Options + 5) = 0;
      goto LAB_0033a6a8;
    }
LAB_0033a570:
    pcVar2 = "%s: expected \"true\" or \"false\" for option value";
    name = value;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)((long)Options + 6) = 1;
        goto LAB_0033a6a8;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)((long)Options + 6) = 0;
        goto LAB_0033a6a8;
      }
      goto LAB_0033a570;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      if (((value->_M_string_length < 3) || (pcVar2 = (value->_M_dataplus)._M_p, *pcVar2 != '\"'))
         || (pcVar2[value->_M_string_length - 1] != '\"')) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&this->super_SceneRepresentation,&loc,
                   "%s: expected quoted string for option value",value);
      }
      std::__cxx11::string::substr((ulong)local_48,(ulong)value);
      this_00 = (string *)(Options + 0x14);
LAB_0033a64b:
      std::__cxx11::string::operator=(this_00,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      goto LAB_0033a6a8;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      if (((value->_M_string_length < 3) || (pcVar2 = (value->_M_dataplus)._M_p, *pcVar2 != '\"'))
         || (pcVar2[value->_M_string_length - 1] != '\"')) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&this->super_SceneRepresentation,&loc,
                   "%s: expected quoted string for option value",value);
      }
      std::__cxx11::string::substr((ulong)local_48,(ulong)value);
      this_00 = (string *)(Options + 0x1c);
      goto LAB_0033a64b;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      iVar1 = atoi((value->_M_dataplus)._M_p);
      *Options = iVar1;
      goto LAB_0033a6a8;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)((long)Options + 7) = 1;
        goto LAB_0033a6a8;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)((long)Options + 7) = 0;
        goto LAB_0033a6a8;
      }
      goto LAB_0033a570;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)((long)Options + 0x19) = 1;
        goto LAB_0033a6a8;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)((long)Options + 0x19) = 0;
        goto LAB_0033a6a8;
      }
      goto LAB_0033a570;
    }
    pcVar2 = "%s: unknown option";
  }
  SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
            (&this->super_SceneRepresentation,&loc,pcVar2,name);
LAB_0033a6a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParsedScene::Option(const std::string &name, const std::string &value, FileLoc loc) {
    std::string nName = normalizeArg(name);

    if (nName == "disablepixeljitter") {
        if (value == "true")
            Options->disablePixelJitter = true;
        else if (value == "false")
            Options->disablePixelJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "disablewavelengthjitter") {
        if (value == "true")
            Options->disableWavelengthJitter = true;
        else if (value == "false")
            Options->disableWavelengthJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "msereferenceimage") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceImage = value.substr(1, value.size() - 2);
    } else if (nName == "msereferenceout") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceOutput = value.substr(1, value.size() - 2);
    } else if (nName == "seed") {
        Options->seed = std::atoi(value.c_str());
    } else if (nName == "forcediffuse") {
        if (value == "true")
            Options->forceDiffuse = true;
        else if (value == "false")
            Options->forceDiffuse = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "pixelstats") {
        if (value == "true")
            Options->recordPixelStatistics = true;
        else if (value == "false")
            Options->recordPixelStatistics = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else
        ErrorExitDeferred(&loc, "%s: unknown option", name);
}